

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcICheck.c
# Opt level: O1

sat_solver *
Bmc_DeriveSolver(Gia_Man_t *p,Gia_Man_t *pMiter,Cnf_Dat_t *pCnf,int nFramesMax,int nTimeOut,
                int fVerbose)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  sat_solver *psVar4;
  int iVar5;
  sat_solver *s;
  int *piVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  abctime aVar9;
  lit *plVar10;
  Cnf_Dat_t *pCVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  timespec ts;
  timespec local_98;
  Gia_Man_t *local_88;
  Vec_Int_t *local_80;
  int local_78;
  int local_74;
  Cnf_Dat_t *local_70;
  int local_64;
  ulong local_60;
  sat_solver *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  Gia_Man_t *local_38;
  
  s = sat_solver_new();
  local_88 = p;
  local_40 = (ulong)(uint)nFramesMax;
  sat_solver_setnvars(s,(nFramesMax + 1) * pCnf->nVars + p->vCos->nSize + p->nRegs);
  if (nTimeOut == 0) {
    aVar9 = 0;
  }
  else {
    iVar5 = clock_gettime(3,&local_98);
    if (iVar5 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = CONCAT44(local_98.tv_nsec._4_4_,(int)local_98.tv_nsec) / 1000 +
              CONCAT44(local_98.tv_sec._4_4_,(uint)local_98.tv_sec) * 1000000;
    }
    aVar9 = lVar8 + (long)nTimeOut * 1000000;
  }
  s->nRuntimeLimit = aVar9;
  iVar5 = local_88->vCos->nSize;
  local_80 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar13 = iVar5;
  }
  local_80->nSize = 0;
  local_80->nCap = iVar13;
  if (iVar13 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar13 << 2);
  }
  pGVar3 = local_88;
  local_80->pArray = piVar6;
  pVVar7 = local_88->vCos;
  if (0 < pVVar7->nSize) {
    lVar8 = 0;
    do {
      if ((pVVar7->pArray[lVar8] < 0) || (pGVar3->nObjs <= pVVar7->pArray[lVar8]))
      goto LAB_0051bdd0;
      if (pGVar3->pObjs == (Gia_Obj_t *)0x0) break;
      iVar5 = pGVar3->nRegs + (int)lVar8;
      if (iVar5 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10b,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush(local_80,iVar5 * 2);
      lVar8 = lVar8 + 1;
      pVVar7 = pGVar3->vCos;
    } while (lVar8 < pVVar7->nSize);
  }
  sat_solver_addclause(s,local_80->pArray,local_80->pArray + local_80->nSize);
  pVVar7 = pGVar3->vCos;
  iVar5 = pVVar7->nSize + pGVar3->nRegs;
  uVar15 = (ulong)(uint)pMiter->nObjs;
  if ((0 < pMiter->nObjs) && (pMiter->pObjs != (Gia_Obj_t *)0x0)) {
    lVar8 = 0;
    do {
      if ((int)uVar15 <= lVar8) goto LAB_0051be8a;
      iVar13 = pCnf->pVarNums[lVar8];
      if (-1 < iVar13) {
        pCnf->pVarNums[lVar8] = iVar13 + iVar5;
      }
      lVar8 = lVar8 + 1;
      uVar15 = (ulong)pMiter->nObjs;
    } while (lVar8 < (long)uVar15);
  }
  if (0 < pCnf->nLiterals) {
    piVar6 = *pCnf->pClauses;
    lVar8 = 0;
    do {
      piVar6[lVar8] = piVar6[lVar8] + iVar5 * 2;
      lVar8 = lVar8 + 1;
    } while (lVar8 < pCnf->nLiterals);
  }
  iVar5 = local_88->nRegs;
  local_74 = pVVar7->nSize + iVar5;
  pVVar7 = local_88->vCos;
  iVar13 = pVVar7->nSize;
  if (iVar5 < iVar13) {
    uVar15 = 0;
    plVar10 = (lit *)((long)&local_98.tv_nsec + 4);
    uVar19 = 0;
    do {
      if ((long)iVar13 <= (long)uVar19) goto LAB_0051bdef;
      if ((pVVar7->pArray[uVar19] < 0) || (local_88->nObjs <= pVVar7->pArray[uVar19]))
      goto LAB_0051bdd0;
      if (local_88->pObjs == (Gia_Obj_t *)0x0) break;
      iVar13 = pMiter->vCos->nSize;
      iVar14 = iVar13 - pMiter->nRegs;
      iVar18 = (int)uVar15;
      if (iVar14 <= iVar18) {
LAB_0051be4c:
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (iVar13 <= iVar18) goto LAB_0051bdef;
      piVar6 = pMiter->vCos->pArray;
      iVar1 = piVar6[uVar19 * 2];
      if (((long)iVar1 < 0) || (pMiter->nObjs <= iVar1)) goto LAB_0051bdd0;
      if (iVar14 <= iVar18 + 1) goto LAB_0051be4c;
      if (iVar13 <= iVar18 + 1) goto LAB_0051bdef;
      iVar13 = piVar6[uVar19 * 2 + 1];
      if (((long)iVar13 < 0) || (pMiter->nObjs <= iVar13)) goto LAB_0051bdd0;
      uVar16 = pCnf->pVarNums[iVar1];
      uVar17 = pCnf->pVarNums[iVar13];
      uVar12 = iVar5 + (int)uVar19;
      local_50 = uVar19;
      local_48 = uVar15;
      if ((int)(uVar12 | uVar16 | uVar17) < 0) {
        __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x174,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      local_98.tv_sec._0_4_ = uVar16 * 2 + 1;
      local_70 = (Cnf_Dat_t *)CONCAT44(local_70._4_4_,(uint)local_98.tv_sec);
      local_98.tv_sec._4_4_ = uVar17 * 2 + 1;
      local_98.tv_nsec._0_4_ = uVar12 * 2 + 1;
      local_78 = local_98.tv_sec._4_4_;
      local_64 = (int)local_98.tv_nsec;
      local_60 = (ulong)uVar16;
      iVar5 = sat_solver_addclause(s,(lit *)&local_98,plVar10);
      if (iVar5 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x17a,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      local_98.tv_sec._0_4_ = local_70._0_4_;
      local_98.tv_sec._4_4_ = uVar17 * 2;
      local_98.tv_nsec._0_4_ = uVar12 * 2;
      iVar5 = sat_solver_addclause(s,(lit *)&local_98,plVar10);
      if (iVar5 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x180,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      uVar16 = (int)local_60 * 2;
      local_98.tv_sec._4_4_ = local_78;
      local_98.tv_sec._0_4_ = uVar16;
      local_98.tv_nsec._0_4_ = uVar12 * 2;
      iVar5 = sat_solver_addclause(s,(lit *)&local_98,plVar10);
      if (iVar5 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x186,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      local_98.tv_nsec._0_4_ = local_64;
      local_98.tv_sec._0_4_ = uVar16;
      local_98.tv_sec._4_4_ = uVar17 * 2;
      iVar5 = sat_solver_addclause(s,(lit *)&local_98,plVar10);
      if (iVar5 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x18c,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      uVar19 = local_50 + 1;
      pVVar7 = local_88->vCos;
      iVar13 = pVVar7->nSize;
      iVar5 = local_88->nRegs;
      uVar15 = (ulong)((int)local_48 + 2);
    } while ((long)uVar19 < (long)(iVar13 - iVar5));
  }
  iVar5 = local_88->nRegs;
  if (0 < iVar5) {
    uVar15 = 0;
    pCVar11 = (Cnf_Dat_t *)0x1;
LAB_0051b5dd:
    plVar10 = (lit *)((long)&local_98.tv_nsec + 4);
    iVar13 = local_88->vCos->nSize;
    iVar14 = (int)uVar15;
    uVar17 = iVar14 + iVar13;
    uVar19 = (ulong)uVar17;
    uVar16 = uVar17 - iVar5;
    if (((int)uVar16 < 0) || (iVar13 <= (int)uVar16)) {
LAB_0051bdef:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar13 = local_88->vCos->pArray[uVar16];
    if ((iVar13 < 0) || (local_88->nObjs <= iVar13)) {
LAB_0051bdd0:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (local_88->pObjs != (Gia_Obj_t *)0x0) {
      iVar13 = pMiter->nRegs;
      local_60 = uVar19;
      if (iVar13 <= iVar14) {
LAB_0051be2d:
        __assert_fail("v < Gia_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a9,"Gia_Obj_t *Gia_ManRi(Gia_Man_t *, int)");
      }
      iVar18 = pMiter->vCos->nSize;
      uVar16 = (iVar18 - iVar13) + iVar14;
      if (((int)uVar16 < 0) || (iVar18 <= (int)uVar16)) goto LAB_0051bdef;
      piVar6 = pMiter->vCos->pArray;
      iVar1 = piVar6[uVar16];
      if (((long)iVar1 < 0) || (pMiter->nObjs <= iVar1)) goto LAB_0051bdd0;
      if (iVar13 <= iVar5 + iVar14) goto LAB_0051be2d;
      uVar16 = ((iVar5 + iVar18) - iVar13) + iVar14;
      if (((int)uVar16 < 0) || (iVar18 <= (int)uVar16)) goto LAB_0051bdef;
      iVar5 = piVar6[uVar16];
      if (((long)iVar5 < 0) || (pMiter->nObjs <= iVar5)) goto LAB_0051bdd0;
      uVar16 = pCnf->pVarNums[iVar1];
      uVar12 = pCnf->pVarNums[iVar5];
      local_70 = pCVar11;
      local_50 = uVar15;
      if ((int)(uVar16 | uVar17 | uVar12) < 0) {
        __assert_fail("iVarF >= 0 && iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x202,"int sat_solver_add_xor_and(sat_solver *, int, int, int, int)");
      }
      local_98.tv_sec._0_4_ = uVar17 * 2 + 1;
      local_98.tv_sec._4_4_ = uVar16 * 2 + 1;
      local_48 = CONCAT44(local_48._4_4_,local_98.tv_sec._4_4_);
      local_98.tv_nsec._0_4_ = uVar12 * 2 + 1;
      local_78 = (uint)local_98.tv_sec;
      local_64 = (int)local_98.tv_nsec;
      iVar5 = sat_solver_addclause(s,(lit *)&local_98,plVar10);
      if (iVar5 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x208,"int sat_solver_add_xor_and(sat_solver *, int, int, int, int)");
      }
      local_98.tv_sec._0_4_ = local_78;
      local_98.tv_sec._4_4_ = uVar16 * 2;
      local_98.tv_nsec._0_4_ = uVar12 * 2;
      iVar5 = sat_solver_addclause(s,(lit *)&local_98,plVar10);
      if (iVar5 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x20e,"int sat_solver_add_xor_and(sat_solver *, int, int, int, int)");
      }
      local_98.tv_sec._0_4_ = local_78;
      local_98.tv_sec._4_4_ = (int)local_70 + -1;
      iVar5 = sat_solver_addclause(s,(lit *)&local_98,(lit *)&local_98.tv_nsec);
      if (iVar5 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x213,"int sat_solver_add_xor_and(sat_solver *, int, int, int, int)");
      }
      uVar17 = (int)local_60 * 2;
      local_98.tv_sec._4_4_ = (undefined4)local_48;
      local_98.tv_nsec._4_4_ = (int)local_70;
      local_98.tv_sec._0_4_ = uVar17;
      local_98.tv_nsec._0_4_ = uVar12 * 2;
      iVar5 = sat_solver_addclause(s,(lit *)&local_98,(lit *)&local_88);
      if (iVar5 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x21a,"int sat_solver_add_xor_and(sat_solver *, int, int, int, int)");
      }
      local_98.tv_nsec._0_4_ = local_64;
      iVar13 = (int)local_70;
      local_98.tv_sec._0_4_ = uVar17;
      local_98.tv_sec._4_4_ = uVar16 * 2;
      local_98.tv_nsec._4_4_ = iVar13;
      iVar5 = sat_solver_addclause(s,(lit *)&local_98,(lit *)&local_88);
      if (iVar5 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                      ,0x221,"int sat_solver_add_xor_and(sat_solver *, int, int, int, int)");
      }
      uVar16 = (int)local_50 + 1;
      uVar15 = (ulong)uVar16;
      iVar5 = local_88->nRegs;
      pCVar11 = (Cnf_Dat_t *)(ulong)(iVar13 + 2);
      if ((int)uVar16 < iVar5) goto LAB_0051b5dd;
    }
  }
  lVar8 = 0;
  while (lVar8 < pCnf->nClauses) {
    iVar5 = sat_solver_addclause(s,pCnf->pClauses[lVar8],pCnf->pClauses[lVar8 + 1]);
    lVar8 = lVar8 + 1;
    if (iVar5 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                    ,0x88,
                    "sat_solver *Bmc_DeriveSolver(Gia_Man_t *, Gia_Man_t *, Cnf_Dat_t *, int, int, int)"
                   );
    }
  }
  if (0 < (int)(uint)local_40) {
    uVar15 = 0;
    local_70 = pCnf;
    local_58 = s;
    local_38 = pMiter;
    do {
      local_80->nSize = 0;
      iVar5 = pMiter->nRegs;
      if (0 < iVar5) {
        iVar13 = 0;
        do {
          iVar14 = pMiter->vCis->nSize;
          uVar16 = (iVar14 - iVar5) + iVar13;
          if (((int)uVar16 < 0) || (iVar14 <= (int)uVar16)) goto LAB_0051bdef;
          iVar5 = pMiter->vCis->pArray[uVar16];
          if (((long)iVar5 < 0) || (pMiter->nObjs <= iVar5)) goto LAB_0051bdd0;
          if (pMiter->pObjs == (Gia_Obj_t *)0x0) break;
          Vec_IntPush(local_80,pCnf->pVarNums[iVar5]);
          iVar13 = iVar13 + 1;
          iVar5 = pMiter->nRegs;
        } while (iVar13 < iVar5);
      }
      iVar5 = pCnf->nVars;
      uVar19 = (ulong)(uint)pMiter->nObjs;
      if ((0 < pMiter->nObjs) && (pMiter->pObjs != (Gia_Obj_t *)0x0)) {
        lVar8 = 0;
        do {
          if ((int)uVar19 <= lVar8) goto LAB_0051be8a;
          iVar13 = pCnf->pVarNums[lVar8];
          if (-1 < iVar13) {
            pCnf->pVarNums[lVar8] = iVar13 + iVar5;
          }
          lVar8 = lVar8 + 1;
          uVar19 = (ulong)pMiter->nObjs;
        } while (lVar8 < (long)uVar19);
      }
      if (0 < pCnf->nLiterals) {
        piVar6 = *pCnf->pClauses;
        lVar8 = 0;
        do {
          piVar6[lVar8] = piVar6[lVar8] + iVar5 * 2;
          lVar8 = lVar8 + 1;
        } while (lVar8 < pCnf->nLiterals);
      }
      local_74 = local_74 + pCnf->nVars;
      uVar19 = (ulong)(uint)pMiter->nRegs;
      local_60 = uVar15;
      if (0 < pMiter->nRegs) {
        lVar8 = 0;
        do {
          iVar5 = pMiter->vCos->nSize;
          uVar15 = (ulong)(uint)(iVar5 - (int)uVar19) + lVar8;
          iVar13 = (int)uVar15;
          if ((iVar13 < 0) || (iVar5 <= iVar13)) goto LAB_0051bdef;
          iVar5 = pMiter->vCos->pArray[uVar15 & 0xffffffff];
          if (((long)iVar5 < 0) || (pMiter->nObjs <= iVar5)) goto LAB_0051bdd0;
          if (pMiter->pObjs == (Gia_Obj_t *)0x0) break;
          if (local_80->nSize <= lVar8) goto LAB_0051bdef;
          uVar16 = local_80->pArray[lVar8];
          if (uVar16 != 0xffffffff) {
            if ((int)(uVar16 | pCnf->pVarNums[iVar5]) < 0) goto LAB_0051be6b;
            uVar17 = pCnf->pVarNums[iVar5] * 2;
            local_98.tv_sec._4_4_ = uVar16 * 2 + 1;
            local_98.tv_sec._0_4_ = uVar17;
            iVar5 = sat_solver_addclause(s,(lit *)&local_98,(lit *)&local_98.tv_nsec);
            s = local_58;
            if (iVar5 != 0) {
              local_98.tv_sec._4_4_ = uVar16 * 2;
              local_98.tv_sec._0_4_ = uVar17 | 1;
              sat_solver_addclause(local_58,(lit *)&local_98,(lit *)&local_98.tv_nsec);
              s = local_58;
            }
          }
          lVar8 = lVar8 + 1;
          uVar19 = (ulong)pMiter->nRegs;
        } while (lVar8 < (long)uVar19);
      }
      pVVar7 = local_88->vCos;
      uVar15 = (ulong)(uint)pVVar7->nSize;
      if (local_88->nRegs < pVVar7->nSize) {
        lVar20 = 0;
        lVar8 = 0;
        do {
          psVar4 = local_58;
          if ((int)uVar15 <= lVar8) goto LAB_0051bdef;
          iVar5 = *(int *)((long)pVVar7->pArray + lVar20 * 2);
          if ((iVar5 < 0) || (local_88->nObjs <= iVar5)) goto LAB_0051bdd0;
          if (local_88->pObjs == (Gia_Obj_t *)0x0) break;
          iVar5 = pMiter->vCos->nSize;
          iVar13 = iVar5 - pMiter->nRegs;
          iVar14 = (int)lVar20;
          if (iVar13 <= iVar14) goto LAB_0051be4c;
          if (iVar5 <= iVar14) goto LAB_0051bdef;
          piVar6 = pMiter->vCos->pArray;
          iVar18 = piVar6[lVar20];
          if (((long)iVar18 < 0) || (pMiter->nObjs <= iVar18)) goto LAB_0051bdd0;
          if (iVar13 <= iVar14 + 1) goto LAB_0051be4c;
          if (iVar5 <= iVar14 + 1) goto LAB_0051bdef;
          iVar5 = piVar6[lVar20 + 1];
          if (((long)iVar5 < 0) || (pMiter->nObjs <= iVar5)) goto LAB_0051bdd0;
          uVar16 = pCnf->pVarNums[iVar18];
          uVar17 = pCnf->pVarNums[iVar5];
          if ((int)(uVar17 | uVar16) < 0) {
LAB_0051be6b:
            __assert_fail("iVarA >= 0 && iVarB >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                          ,0x136,"int sat_solver_add_buffer(sat_solver *, int, int, int)");
          }
          uVar16 = uVar16 * 2;
          local_98.tv_sec._4_4_ = uVar17 * 2 + 1;
          local_98.tv_sec._0_4_ = uVar16;
          iVar5 = sat_solver_addclause(local_58,(lit *)&local_98,(lit *)&local_98.tv_nsec);
          if (iVar5 != 0) {
            local_98.tv_sec._4_4_ = uVar17 * 2;
            local_98.tv_sec._0_4_ = uVar16 | 1;
            sat_solver_addclause(psVar4,(lit *)&local_98,(lit *)&local_98.tv_nsec);
          }
          lVar8 = lVar8 + 1;
          pVVar7 = local_88->vCos;
          uVar15 = (ulong)pVVar7->nSize;
          lVar20 = lVar20 + 2;
          pCnf = local_70;
          s = psVar4;
          pMiter = local_38;
        } while (lVar8 < (long)(uVar15 - (long)local_88->nRegs));
      }
      iVar5 = local_88->nRegs;
      if (0 < iVar5) {
        iVar13 = 0;
        iVar14 = 1;
        do {
          psVar4 = local_58;
          iVar18 = local_88->vCos->nSize;
          uVar16 = (iVar18 - iVar5) + iVar13;
          if (((int)uVar16 < 0) || (iVar18 <= (int)uVar16)) goto LAB_0051bdef;
          iVar18 = local_88->vCos->pArray[uVar16];
          if ((iVar18 < 0) || (local_88->nObjs <= iVar18)) goto LAB_0051bdd0;
          if (local_88->pObjs == (Gia_Obj_t *)0x0) break;
          iVar18 = pMiter->nRegs;
          if (iVar18 <= iVar13) goto LAB_0051be2d;
          iVar1 = pMiter->vCos->nSize;
          uVar16 = (iVar1 - iVar18) + iVar13;
          if (((int)uVar16 < 0) || (iVar1 <= (int)uVar16)) goto LAB_0051bdef;
          piVar6 = pMiter->vCos->pArray;
          iVar2 = piVar6[uVar16];
          if (((long)iVar2 < 0) || (pMiter->nObjs <= iVar2)) goto LAB_0051bdd0;
          if (iVar18 <= iVar5 + iVar13) goto LAB_0051be2d;
          uVar16 = ((iVar5 + iVar1) - iVar18) + iVar13;
          if (((int)uVar16 < 0) || (iVar1 <= (int)uVar16)) goto LAB_0051bdef;
          iVar5 = piVar6[uVar16];
          if (((long)iVar5 < 0) || (pMiter->nObjs <= iVar5)) goto LAB_0051bdd0;
          uVar16 = pCnf->pVarNums[iVar2];
          uVar17 = pCnf->pVarNums[iVar5];
          if ((int)(uVar17 | uVar16) < 0) {
            __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarEn >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                          ,0x14b,
                          "int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
          }
          uVar16 = uVar16 * 2;
          local_98.tv_sec._4_4_ = uVar17 * 2 + 1;
          local_98.tv_sec._0_4_ = uVar16;
          local_98.tv_nsec._0_4_ = iVar14;
          iVar5 = sat_solver_addclause
                            (local_58,(lit *)&local_98,(lit *)((long)&local_98.tv_nsec + 4));
          if (iVar5 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                          ,0x151,
                          "int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
          }
          local_98.tv_sec._4_4_ = uVar17 * 2;
          local_98.tv_sec._0_4_ = uVar16 | 1;
          local_98.tv_nsec._0_4_ = iVar14;
          iVar5 = sat_solver_addclause(psVar4,(lit *)&local_98,(lit *)((long)&local_98.tv_nsec + 4))
          ;
          if (iVar5 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                          ,0x157,
                          "int sat_solver_add_buffer_enable(sat_solver *, int, int, int, int)");
          }
          iVar13 = iVar13 + 1;
          iVar5 = local_88->nRegs;
          iVar14 = iVar14 + 2;
          pCnf = local_70;
          s = psVar4;
          pMiter = local_38;
        } while (iVar13 < iVar5);
      }
      uVar15 = local_60;
      lVar8 = 0;
      while (lVar8 < pCnf->nClauses) {
        iVar5 = sat_solver_addclause(s,pCnf->pClauses[lVar8],pCnf->pClauses[lVar8 + 1]);
        lVar8 = lVar8 + 1;
        if (iVar5 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                        ,0xb1,
                        "sat_solver *Bmc_DeriveSolver(Gia_Man_t *, Gia_Man_t *, Cnf_Dat_t *, int, int, int)"
                       );
        }
      }
      uVar16 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar16;
    } while (uVar16 != (uint)local_40);
  }
  uVar15 = (ulong)(uint)pMiter->nObjs;
  if ((0 < pMiter->nObjs) && (pMiter->pObjs != (Gia_Obj_t *)0x0)) {
    lVar8 = 0;
    do {
      if ((int)uVar15 <= lVar8) {
LAB_0051be8a:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar5 = pCnf->pVarNums[lVar8];
      if (-1 < iVar5) {
        pCnf->pVarNums[lVar8] = iVar5 - local_74;
      }
      lVar8 = lVar8 + 1;
      uVar15 = (ulong)pMiter->nObjs;
    } while (lVar8 < (long)uVar15);
  }
  if (0 < pCnf->nLiterals) {
    piVar6 = *pCnf->pClauses;
    lVar8 = 0;
    do {
      piVar6[lVar8] = piVar6[lVar8] + local_74 * -2;
      lVar8 = lVar8 + 1;
    } while (lVar8 < pCnf->nLiterals);
  }
  if (local_80->pArray != (int *)0x0) {
    free(local_80->pArray);
    local_80->pArray = (int *)0x0;
  }
  free(local_80);
  return s;
}

Assistant:

sat_solver * Bmc_DeriveSolver( Gia_Man_t * p, Gia_Man_t * pMiter, Cnf_Dat_t * pCnf, int nFramesMax, int nTimeOut, int fVerbose )
{
    sat_solver * pSat;
    Vec_Int_t * vLits;
    Gia_Obj_t * pObj, * pObj0, * pObj1;
    int i, k, iVar0, iVar1, iVarOut;
    int VarShift = 0;

    // start the SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, Gia_ManRegNum(p) + Gia_ManCoNum(p) + pCnf->nVars * (nFramesMax + 1) );
    sat_solver_set_runtime_limit( pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );

    // add one large OR clause
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_IntPush( vLits, Abc_Var2Lit(Gia_ManRegNum(p) + i, 0) );
    sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );

    // load the last timeframe
    Cnf_DataLiftGia( pCnf, pMiter, Gia_ManRegNum(p) + Gia_ManCoNum(p) );
    VarShift += Gia_ManRegNum(p) + Gia_ManCoNum(p);

    // add XOR clauses
    Gia_ManForEachPo( p, pObj, i )
    {
        pObj0 = Gia_ManPo( pMiter, 2*i+0 );
        pObj1 = Gia_ManPo( pMiter, 2*i+1 );
        iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj0)];
        iVar1 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj1)];
        iVarOut = Gia_ManRegNum(p) + i;
        sat_solver_add_xor( pSat, iVar0, iVar1, iVarOut, 0 );
    }
    Gia_ManForEachRi( p, pObj, i )
    {
        pObj0 = Gia_ManRi( pMiter, i );
        pObj1 = Gia_ManRi( pMiter, i + Gia_ManRegNum(p) );
        iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj0)];
        iVar1 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj1)];
        iVarOut = Gia_ManRegNum(p) + Gia_ManPoNum(p) + i;
        sat_solver_add_xor_and( pSat, iVarOut, iVar0, iVar1, i );
    }
    // add timeframe clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            assert( 0 );

    // add other timeframes
    for ( k = 0; k < nFramesMax; k++ )
    {
        // collect variables of the RO nodes
        Vec_IntClear( vLits );
        Gia_ManForEachRo( pMiter, pObj, i )
            Vec_IntPush( vLits, pCnf->pVarNums[Gia_ObjId(pMiter, pObj)] );
        // lift CNF again
        Cnf_DataLiftGia( pCnf, pMiter, pCnf->nVars );
        VarShift += pCnf->nVars;
        // stitch the clauses
        Gia_ManForEachRi( pMiter, pObj, i )
        {
            iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj)];
            iVar1 = Vec_IntEntry( vLits, i );
            if ( iVar1 == -1 )
                continue;
            sat_solver_add_buffer( pSat, iVar0, iVar1, 0 );
        }
        // add equality clauses for the COs
        Gia_ManForEachPo( p, pObj, i )
        {
            pObj0 = Gia_ManPo( pMiter, 2*i+0 );
            pObj1 = Gia_ManPo( pMiter, 2*i+1 );
            iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj0)];
            iVar1 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj1)];
            sat_solver_add_buffer( pSat, iVar0, iVar1, 0 );
        }
        Gia_ManForEachRi( p, pObj, i )
        {
            pObj0 = Gia_ManRi( pMiter, i );
            pObj1 = Gia_ManRi( pMiter, i + Gia_ManRegNum(p) );
            iVar0 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj0)];
            iVar1 = pCnf->pVarNums[Gia_ObjId(pMiter, pObj1)];
            sat_solver_add_buffer_enable( pSat, iVar0, iVar1, i, 0 );
        }
        // add timeframe clauses
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
                assert( 0 );
    }
//    sat_solver_compress( pSat );
    Cnf_DataLiftGia( pCnf, pMiter, -VarShift );
    Vec_IntFree( vLits );
    return pSat;
}